

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O2

int mainMenu(ifstream *loadFile,ofstream *compressedFile,ofstream *mapper)

{
  int iVar1;
  ostream *poVar2;
  string folderName;
  int userChoice;
  string fileName;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8 [20];
  int local_a4;
  string local_a0;
  string local_80;
  string local_60;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "Welcome to Pied Piper the brand new middle out compression engine");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Please select what you would like to do...");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"1) Compress File");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"2) Decompress File");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"3) Close Program and install virus");
  std::endl<char,std::char_traits<char>>(poVar2);
  local_a4 = 0;
  std::istream::operator>>((istream *)&std::cin,&local_a4);
  if (local_a4 == 3) {
    return 0;
  }
  iVar1 = local_a4;
  if (local_a4 == 2) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Please enter the path of the folder containing the .pra mapper and compressed file"
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
    local_c8 = local_b8;
    local_c0 = 0;
    local_b8[0] = 0;
    std::operator>>((istream *)&std::cin,(string *)&local_c8);
    std::__cxx11::string::string((string *)&local_a0,(string *)&local_c8);
    decompress(&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar2 = std::operator<<((ostream *)&std::cout,"DECOMPRESSING...");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar1 = std::__cxx11::string::~string((string *)&local_c8);
  }
  if (iVar1 == 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Please enter the folder path to where you would like to save .pra file..."
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
    local_c8 = local_b8;
    local_c0 = 0;
    local_b8[0] = 0;
    std::operator>>((istream *)&std::cin,(string *)&local_c8);
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Please enter directory of file with file name...");
    std::endl<char,std::char_traits<char>>(poVar2);
    local_40 = local_30;
    local_38 = 0;
    local_30[0] = 0;
    std::operator>>((istream *)&std::cin,(string *)&local_40);
    std::__cxx11::string::string((string *)&local_60,(string *)&local_c8);
    std::__cxx11::string::string((string *)&local_80,(string *)&local_40);
    initalizeFiles(loadFile,compressedFile,mapper,&local_60,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar2 = std::operator<<((ostream *)&std::cout,"COMPRESSING.....");
    std::endl<char,std::char_traits<char>>(poVar2);
    preCompress(loadFile,compressedFile);
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Not a valid choice pick again...");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_c8);
  _Unwind_Resume(poVar2);
}

Assistant:

int mainMenu(ifstream &loadFile, ofstream &compressedFile, ofstream &mapper)
{

    // Display user cmd line interface for selection if they want to compress or decmopress or close programm
    cout << "Welcome to Pied Piper the brand new middle out compression engine"<< endl;
    cout << "Please select what you would like to do..."<< endl;
    cout << "1) Compress File" << endl;
    cout << "2) Decompress File" <<endl;
    cout << "3) Close Program and install virus"<<endl;

    // Take in user input
    int userChoice = 0;
    cin >> userChoice;

    // Check agianst choices
    if (userChoice == 1)
    {
        // Compress File

        // If compressing take in the folder they want the .pra files stored I recommend a folder called Compressed
        cout << "Please enter the folder path to where you would like to save .pra file..." <<endl;
        string folderName;
        cin >> folderName;

        // Ask the user to enter the path to the source file they want to try and compress

        cout << "Please enter directory of file with file name..." <<endl;
        string fileName;
        cin >> fileName;


        // Initialize the fstreams based on the values passed in by the user
        initalizeFiles(loadFile, compressedFile, mapper, folderName, fileName);

        cout << endl; // Display cleanup

        // Inform the user compression is starting
        // TODO: Add progress bar
        cout << "COMPRESSING....."<<endl;

        // Parse through the file once looking for unique words and saving the top three used with corresponding single
        // byte representations
        preCompress(loadFile, compressedFile);

        // Parse through file a second time this time looking for any word matching the top three from preCompression
        // and replacing them with the single byte mapping
        compressor(loadFile, compressedFile, mapper);


    }
    else if (userChoice == 2)
    {
        // Decompress File
        // If Decompressing have user enter folder of .pra files
        cout << "Please enter the path of the folder containing the .pra mapper and compressed file"<<endl;
        string folderName;
        cin >> folderName;

        // Run decopression saving a new decmopressed file in the same folder as the main.cpp file and call it
        // Decmpressed.txt
        // TODO: Change save directory to compressed .pra folder and resave as original source file name

        decompress(folderName);

        // Inform the user its decompressing their file
        cout << endl;

        cout << "DECOMPRESSING..." <<endl;
    }
    else if (userChoice == 3)
    {
        // Close the program

        return 0;

    }
    else
    {
        // User did not select 1-3
        cerr << "Not a valid choice pick again..." <<endl;

    }
}